

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_chorba_c.c
# Opt level: O0

uint32_t crc32_chorba_small_nondestructive_32bit(uint32_t crc,uint32_t *buf,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  ulong in_RDX;
  long in_RSI;
  uint in_EDI;
  uint32_t out10;
  uint32_t out9;
  uint32_t out8;
  uint32_t out7;
  uint32_t out6;
  uint32_t out5;
  uint32_t out4;
  uint32_t out3;
  uint32_t out2;
  uint32_t out1;
  uint32_t j7;
  uint32_t j6;
  uint32_t j4;
  uint32_t j3;
  uint32_t j2;
  uint32_t j1;
  uint32_t i7;
  uint32_t i6;
  uint32_t i4;
  uint32_t i3;
  uint32_t i2;
  uint32_t i1;
  uint32_t h7;
  uint32_t h6;
  uint32_t h4;
  uint32_t h3;
  uint32_t h2;
  uint32_t h1;
  uint32_t g7;
  uint32_t g6;
  uint32_t g4;
  uint32_t g3;
  uint32_t g2;
  uint32_t g1;
  uint32_t f7;
  uint32_t f6;
  uint32_t f4;
  uint32_t f3;
  uint32_t f2;
  uint32_t f1;
  uint32_t e7;
  uint32_t e6;
  uint32_t e4;
  uint32_t e3;
  uint32_t e2;
  uint32_t e1;
  uint32_t d7;
  uint32_t d6;
  uint32_t d4;
  uint32_t d3;
  uint32_t d2;
  uint32_t d1;
  uint32_t c7;
  uint32_t c6;
  uint32_t c4;
  uint32_t c3;
  uint32_t c2;
  uint32_t c1;
  uint32_t b7;
  uint32_t b6;
  uint32_t b4;
  uint32_t b3;
  uint32_t b2;
  uint32_t b1;
  uint32_t a7;
  uint32_t a6;
  uint32_t a4;
  uint32_t a3;
  uint32_t a2;
  uint32_t a1;
  uint32_t in10;
  uint32_t in9;
  uint32_t in8;
  uint32_t in7;
  uint32_t in6;
  uint32_t in5;
  uint32_t in4;
  uint32_t in3;
  uint32_t in2;
  uint32_t in1;
  size_t i;
  uint32_t next10;
  uint32_t next9;
  uint32_t next8;
  uint32_t next7;
  uint32_t next6;
  uint32_t next5;
  uint32_t next4;
  uint32_t next3;
  uint32_t next2;
  uint32_t next1;
  uint32_t final [20];
  uint32_t *input;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  uint in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  uint in_stack_fffffffffffffea4;
  long local_a8;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_20;
  ulong local_18;
  uint local_4;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  local_4 = in_EDI;
  memset(&local_78,0,0x50);
  local_7c = local_4;
  local_4 = 0;
  local_80 = 0;
  local_84 = 0;
  local_88 = 0;
  local_8c = 0;
  local_90 = 0;
  local_94 = 0;
  local_98 = 0;
  local_9c = 0;
  local_a0 = 0;
  for (local_a8 = 0; local_a8 + 0x50U < local_18; local_a8 = local_a8 + 0x28) {
    local_7c = local_7c ^ *(uint *)(local_20 + local_a8);
    local_80 = local_80 ^ *(uint *)(local_20 + 4 + local_a8);
    local_84 = local_84 ^ *(uint *)(local_20 + 8 + local_a8);
    local_88 = local_88 ^ *(uint *)(local_20 + 0xc + local_a8);
    uVar1 = local_8c ^ local_7c << 0x11 ^ *(uint *)(local_20 + 0x10 + local_a8);
    uVar2 = local_90 ^ local_7c >> 0xf ^ local_7c << 0x17 ^ local_80 << 0x11 ^
            *(uint *)(local_20 + 0x14 + local_a8);
    uVar3 = local_94 ^ local_7c >> 9 ^ local_7c << 0x13 ^ local_80 >> 0xf ^ local_80 << 0x17 ^
            local_84 << 0x11 ^ *(uint *)(local_20 + 0x18 + local_a8);
    uVar4 = local_98 ^ local_7c >> 0xd ^ local_80 >> 9 ^ local_80 << 0x13 ^
            local_84 >> 0xf ^ local_84 << 0x17 ^ local_88 << 0x11 ^
            *(uint *)(local_20 + 0x1c + local_a8);
    in_stack_fffffffffffffea4 = uVar2 << 0xc;
    in_stack_fffffffffffffe9c = uVar3 << 0x11;
    in_stack_fffffffffffffe98 = uVar3 >> 0xf ^ uVar3 << 0x17;
    in_stack_fffffffffffffe94 = uVar3 >> 9 ^ uVar3 << 0x13;
    in_stack_fffffffffffffe90 = uVar3 >> 0xd;
    uVar5 = local_9c ^ local_80 >> 0xd ^ local_84 >> 9 ^ local_84 << 0x13 ^
            local_88 >> 0xf ^ local_88 << 0x17 ^ uVar1 << 0x11 ^
            *(uint *)(local_20 + 0x20 + local_a8);
    uVar6 = local_a0 ^ local_7c << 0xc ^ local_84 >> 0xd ^ local_88 >> 9 ^ local_88 << 0x13 ^
            uVar1 >> 0xf ^ uVar1 << 0x17 ^ uVar2 << 0x11 ^ *(uint *)(local_20 + 0x24 + local_a8);
    local_a0 = uVar6 >> 0x14;
    local_7c = local_7c >> 0x14 ^ local_80 << 0xc ^ local_88 >> 0xd ^ uVar1 >> 9 ^ uVar1 << 0x13 ^
               uVar2 >> 0xf ^ uVar2 << 0x17 ^ in_stack_fffffffffffffe9c;
    local_80 = local_80 >> 0x14 ^ local_84 << 0xc ^ uVar1 >> 0xd ^ uVar2 >> 9 ^ uVar2 << 0x13 ^
               in_stack_fffffffffffffe98 ^ uVar4 << 0x11;
    local_84 = local_84 >> 0x14 ^ local_88 << 0xc ^ uVar2 >> 0xd ^ in_stack_fffffffffffffe94 ^
               uVar4 >> 0xf ^ uVar4 << 0x17 ^ uVar5 << 0x11;
    local_88 = local_88 >> 0x14 ^ uVar1 << 0xc ^ in_stack_fffffffffffffe90 ^
               uVar4 >> 9 ^ uVar4 << 0x13 ^ uVar5 >> 0xf ^ uVar5 << 0x17 ^ uVar6 << 0x11;
    local_8c = uVar1 >> 0x14 ^ in_stack_fffffffffffffea4 ^ uVar4 >> 0xd ^ uVar5 >> 9 ^ uVar5 << 0x13
               ^ uVar6 >> 0xf ^ uVar6 << 0x17;
    local_90 = uVar2 >> 0x14 ^ uVar3 << 0xc ^ uVar5 >> 0xd ^ uVar6 >> 9 ^ uVar6 << 0x13;
    local_94 = uVar3 >> 0x14 ^ uVar4 << 0xc ^ uVar6 >> 0xd;
    local_98 = uVar4 >> 0x14 ^ uVar5 << 0xc;
    local_9c = uVar5 >> 0x14 ^ uVar6 << 0xc;
  }
  memcpy(&local_78,(void *)(local_20 + local_a8),local_18 - local_a8);
  local_78 = local_7c ^ local_78;
  local_74 = local_80 ^ local_74;
  local_70 = local_84 ^ local_70;
  local_6c = local_88 ^ local_6c;
  local_68 = local_8c ^ local_68;
  local_64 = local_90 ^ local_64;
  local_60 = local_94 ^ local_60;
  local_5c = local_98 ^ local_5c;
  local_58 = local_9c ^ local_58;
  local_54 = local_a0 ^ local_54;
  uVar7 = crc32_braid_internal
                    (in_stack_fffffffffffffea4,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  return uVar7;
}

Assistant:

Z_INTERNAL uint32_t crc32_chorba_small_nondestructive_32bit (uint32_t crc, const uint32_t* buf, size_t len) {
    const uint32_t* input = buf;
    uint32_t final[20] = {0};

    uint32_t next1 = crc;
    crc = 0;
    uint32_t next2 = 0;
    uint32_t next3 = 0;
    uint32_t next4 = 0;
    uint32_t next5 = 0;
    uint32_t next6 = 0;
    uint32_t next7 = 0;
    uint32_t next8 = 0;
    uint32_t next9 = 0;
    uint32_t next10 = 0;

    size_t i = 0;
    for(; i + 80 < len; i += 40) {
        uint32_t in1;
        uint32_t in2;
        uint32_t in3;
        uint32_t in4;
        uint32_t in5;
        uint32_t in6;
        uint32_t in7;
        uint32_t in8;
        uint32_t in9;
        uint32_t in10;

        uint32_t a1, a2, a3, a4, a6, a7;
        uint32_t b1, b2, b3, b4, b6, b7;
        uint32_t c1, c2, c3, c4, c6, c7;
        uint32_t d1, d2, d3, d4, d6, d7;
        uint32_t e1, e2, e3, e4, e6, e7;
        uint32_t f1, f2, f3, f4, f6, f7;
        uint32_t g1, g2, g3, g4, g6, g7;
        uint32_t h1, h2, h3, h4, h6, h7;
        uint32_t i1, i2, i3, i4, i6, i7;
        uint32_t j1, j2, j3, j4, j6, j7;

        uint32_t out1;
        uint32_t out2;
        uint32_t out3;
        uint32_t out4;
        uint32_t out5;
        uint32_t out6;
        uint32_t out7;
        uint32_t out8;
        uint32_t out9;
        uint32_t out10;

        in1 = input[i/sizeof(uint32_t) + 0];
        in2 = input[i/sizeof(uint32_t) + 1];
        in3 = input[i/sizeof(uint32_t) + 2];
        in4 = input[i/sizeof(uint32_t) + 3];
#if BYTE_ORDER == BIG_ENDIAN
        in1 = ZSWAP32(in1);
        in2 = ZSWAP32(in2);
        in3 = ZSWAP32(in3);
        in4 = ZSWAP32(in4);
#endif
        in1 ^= next1;
        in2 ^= next2;
        in3 ^= next3;
        in4 ^= next4;

        a1 = (in1 << 17);
        a2 = (in1 >> 15) ^ (in1 << 23);
        a3 = (in1 >> 9) ^ (in1 << 19);
        a4 = (in1 >> 13);
        a6 = (in1 << 12);
        a7 = (in1 >> 20);

        b1 = (in2 << 17);
        b2 = (in2 >> 15) ^ (in2 << 23);
        b3 = (in2 >> 9) ^ (in2 << 19);
        b4 = (in2 >> 13);
        b6 = (in2 << 12);
        b7 = (in2 >> 20);

        c1 = (in3 << 17);
        c2 = (in3 >> 15) ^ (in3 << 23);
        c3 = (in3 >> 9) ^ (in3 << 19);
        c4 = (in3 >> 13);
        c6 = (in3 << 12);
        c7 = (in3 >> 20);

        d1 = (in4 << 17);
        d2 = (in4 >> 15) ^ (in4 << 23);
        d3 = (in4 >> 9) ^ (in4 << 19);
        d4 = (in4 >> 13);
        d6 = (in4 << 12);
        d7 = (in4 >> 20);

        in5 = input[i/sizeof(uint32_t) + 4];
        in6 = input[i/sizeof(uint32_t) + 5];
        in7 = input[i/sizeof(uint32_t) + 6];
        in8 = input[i/sizeof(uint32_t) + 7];
#if BYTE_ORDER == BIG_ENDIAN
        in5 = ZSWAP32(in5);
        in6 = ZSWAP32(in6);
        in7 = ZSWAP32(in7);
        in8 = ZSWAP32(in8);
#endif
        in5 ^= next5 ^ a1;
        in6 ^= next6 ^ a2 ^ b1;
        in7 ^= next7 ^ a3 ^ b2 ^ c1;
        in8 ^= next8 ^ a4 ^ b3 ^ c2 ^ d1;

        e1 = (in5 << 17);
        e2 = (in5 >> 15) ^ (in5 << 23);
        e3 = (in5 >> 9) ^ (in5 << 19);
        e4 = (in5 >> 13);
        e6 = (in5 << 12);
        e7 = (in5 >> 20);

        f1 = (in6 << 17);
        f2 = (in6 >> 15) ^ (in6 << 23);
        f3 = (in6 >> 9) ^ (in6 << 19);
        f4 = (in6 >> 13);
        f6 = (in6 << 12);
        f7 = (in6 >> 20);

        g1 = (in7 << 17);
        g2 = (in7 >> 15) ^ (in7 << 23);
        g3 = (in7 >> 9) ^ (in7 << 19);
        g4 = (in7 >> 13);
        g6 = (in7 << 12);
        g7 = (in7 >> 20);

        h1 = (in8 << 17);
        h2 = (in8 >> 15) ^ (in8 << 23);
        h3 = (in8 >> 9) ^ (in8 << 19);
        h4 = (in8 >> 13);
        h6 = (in8 << 12);
        h7 = (in8 >> 20);

        in9 = input[i/sizeof(uint32_t) + 8];
        in10 = input[i/sizeof(uint32_t) + 9];
#if BYTE_ORDER == BIG_ENDIAN
        in9 = ZSWAP32(in9);
        in10 = ZSWAP32(in10);
#endif
        in9 ^= next9 ^ b4 ^ c3 ^ d2 ^ e1;
        in10 ^= next10 ^ a6 ^ c4 ^ d3 ^ e2 ^ f1;

        i1 = (in9 << 17);
        i2 = (in9 >> 15) ^ (in9 << 23);
        i3 = (in9 >> 9) ^ (in9 << 19);
        i4 = (in9 >> 13);
        i6 = (in9 << 12);
        i7 = (in9 >> 20);

        j1 = (in10 << 17);
        j2 = (in10 >> 15) ^ (in10 << 23);
        j3 = (in10 >> 9) ^ (in10 << 19);
        j4 = (in10 >> 13);
        j6 = (in10 << 12);
        j7 = (in10 >> 20);

        out1 = a7 ^ b6 ^ d4 ^ e3 ^ f2 ^ g1;
        out2 = b7 ^ c6 ^ e4 ^ f3 ^ g2 ^ h1;
        out3 = c7 ^ d6 ^ f4 ^ g3 ^ h2 ^ i1;
        out4 = d7 ^ e6 ^ g4 ^ h3 ^ i2 ^ j1;
        out5 = e7 ^ f6 ^ h4 ^ i3 ^ j2;
        out6 = f7 ^ g6 ^ i4 ^ j3;
        out7 = g7 ^ h6 ^ j4;
        out8 = h7 ^ i6;
        out9 = i7 ^ j6;
        out10 = j7;

        next1 = out1;
        next2 = out2;
        next3 = out3;
        next4 = out4;
        next5 = out5;
        next6 = out6;
        next7 = out7;
        next8 = out8;
        next9 = out9;
        next10 = out10;

    }
#if BYTE_ORDER == BIG_ENDIAN
    next1 = ZSWAP32(next1);
    next2 = ZSWAP32(next2);
    next3 = ZSWAP32(next3);
    next4 = ZSWAP32(next4);
    next5 = ZSWAP32(next5);
    next6 = ZSWAP32(next6);
    next7 = ZSWAP32(next7);
    next8 = ZSWAP32(next8);
    next9 = ZSWAP32(next9);
    next10 = ZSWAP32(next10);
#endif

    memcpy(final, input+(i/sizeof(uint32_t)), len-i);
    final[0] ^= next1;
    final[1] ^= next2;
    final[2] ^= next3;
    final[3] ^= next4;
    final[4] ^= next5;
    final[5] ^= next6;
    final[6] ^= next7;
    final[7] ^= next8;
    final[8] ^= next9;
    final[9] ^= next10;

    crc = crc32_braid_internal(crc, (uint8_t*) final, len-i);

    return crc;
}